

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O2

void google::protobuf::anon_unknown_6::ReportReflectionUsageMessageError
               (Descriptor *expected,Descriptor *actual,FieldDescriptor *field,char *method)

{
  LogMessage local_90;
  char *method_local;
  basic_string_view<char,_std::char_traits<char>_> local_78;
  basic_string_view<char,_std::char_traits<char>_> local_68;
  FormatSpec<const_char_*,_std::basic_string_view<char>,_std::basic_string_view<char>,_std::basic_string_view<char>_>
  local_58;
  string local_48;
  basic_string_view<char,_std::char_traits<char>_> local_28;
  
  method_local = method;
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)&local_90,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_reflection.cc"
             ,0xe1);
  local_58.super_type.spec_.data_ =
       "Protocol Buffer reflection usage error:\n  Method       : google::protobuf::Reflection::%s\n  Expected type: %s\n  Actual type  : %s\n  Field        : %s\n  Problem      : Message is not the right object for reflection"
  ;
  local_58.super_type.spec_.size_ = 0xd5;
  local_68._M_str = (expected->all_names_).payload_;
  local_68._M_len = (size_t)*(ushort *)(local_68._M_str + 2);
  local_68._M_str = local_68._M_str + ~local_68._M_len;
  local_78._M_str = (actual->all_names_).payload_;
  local_78._M_len = (size_t)*(ushort *)(local_78._M_str + 2);
  local_78._M_str = local_78._M_str + ~local_78._M_len;
  if (field == (FieldDescriptor *)0x0) {
    local_28._M_str = "n/a";
    local_28._M_len = 3;
  }
  else {
    local_28._M_str = (field->all_names_).payload_;
    local_28._M_len = (size_t)*(ushort *)(local_28._M_str + 2);
    local_28._M_str = local_28._M_str + ~local_28._M_len;
  }
  absl::lts_20250127::
  StrFormat<const_char_*,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
            (&local_48,&local_58,&method_local,&local_68,&local_78,&local_28);
  absl::lts_20250127::log_internal::LogMessage::operator<<(&local_90,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_90);
}

Assistant:

void ReportReflectionUsageMessageError(const Descriptor* expected,
                                       const Descriptor* actual,
                                       const FieldDescriptor* field,
                                       const char* method) {
  ABSL_LOG(FATAL) << absl::StrFormat(
      "Protocol Buffer reflection usage error:\n"
      "  Method       : google::protobuf::Reflection::%s\n"
      "  Expected type: %s\n"
      "  Actual type  : %s\n"
      "  Field        : %s\n"
      "  Problem      : Message is not the right object for reflection",
      method, expected->full_name(), actual->full_name(),
      (field != nullptr ? field->full_name() : "n/a"));
}